

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O2

int coda_expression_eval_void(coda_expression *expr,coda_cursor *cursor)

{
  int iVar1;
  char *message;
  eval_info info;
  
  if (expr->result_type == coda_expression_void) {
    if (cursor == (coda_cursor *)0x0) {
      if (expr->is_constant == 0) {
        message = "cursor argument may not be NULL if expression is not constant";
        goto LAB_0010cee5;
      }
      info.orig_cursor = (coda_cursor *)0x0;
    }
    else {
      info.orig_cursor = cursor;
      memcpy(&info.cursor,cursor,0x310);
    }
    info.index[2] = 0;
    info.variable_index = 0;
    info.index[0] = 0;
    info.index[1] = 0;
    info.variable_name = (char *)0x0;
    iVar1 = eval_void(&info,expr);
  }
  else {
    message = "expression is not a \'void\' expression";
LAB_0010cee5:
    coda_set_error(-100,message);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int coda_expression_eval_void(const coda_expression *expr, const coda_cursor *cursor)
{
    eval_info info;

    if (expr->result_type != coda_expression_void)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "expression is not a 'void' expression");
        return -1;
    }
    if (cursor == NULL && !expr->is_constant)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument may not be NULL if expression is not constant");
        return -1;
    }

    init_eval_info(&info, cursor);
    return eval_void(&info, expr);
}